

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cClipDistance.hpp
# Opt level: O0

int __thiscall
gl3cts::ClipDistance::Utility::VertexBufferObject<float>::bind
          (VertexBufferObject<float> *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  GLenum GVar1;
  VertexBufferObject<float> *extraout_RAX;
  VertexBufferObject<float> *this_local;
  
  if (this->m_vertex_buffer_object_id == 0) {
    this_local._7_1_ = 0;
  }
  else {
    (*this->m_gl->bindBuffer)(this->m_target,this->m_vertex_buffer_object_id);
    GVar1 = (*this->m_gl->getError)();
    glu::checkError(GVar1,"glBindBuffer call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.hpp"
                    ,0x174);
    if (this->m_target == 0x8c8e) {
      (*this->m_gl->bindBufferBase)(0x8c8e,0,this->m_vertex_buffer_object_id);
      GVar1 = (*this->m_gl->getError)();
      glu::checkError(GVar1,"glBindBufferBase call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.hpp"
                      ,0x179);
      this = extraout_RAX;
    }
    this_local._7_1_ = 1;
  }
  return (int)CONCAT71((int7)((ulong)this >> 8),this_local._7_1_);
}

Assistant:

bool gl3cts::ClipDistance::Utility::VertexBufferObject<T>::bind()
{
	if (m_vertex_buffer_object_id)
	{
		m_gl.bindBuffer(m_target, m_vertex_buffer_object_id);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindBuffer call failed.");

		if (m_target == GL_TRANSFORM_FEEDBACK_BUFFER)
		{
			m_gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_vertex_buffer_object_id);
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindBufferBase call failed.");
		}

		return true;
	}

	return false;
}